

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::ShaderAtomicMaxCase::ShaderAtomicMaxCase
          (ShaderAtomicMaxCase *this,Context *context,char *name,AtomicOperandType operandType,
          DataType type,Precision precision)

{
  deUint32 dVar1;
  deUint32 dVar2;
  UVec3 local_14;
  
  local_14.m_data[0] = 3;
  local_14.m_data[1] = 2;
  local_14.m_data[2] = 1;
  ShaderAtomicOpCase::ShaderAtomicOpCase
            (&this->super_ShaderAtomicOpCase,context,name,"atomicMax",operandType,type,precision,
             &local_14);
  (this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderAtomicOpCase_01e4af70;
  dVar2 = 0xfffffc18;
  if ((this->super_ShaderAtomicOpCase).m_precision == PRECISION_LOWP) {
    dVar2 = 0xffffff9c;
  }
  dVar1 = 0;
  if ((this->super_ShaderAtomicOpCase).m_type == TYPE_INT) {
    dVar1 = dVar2;
  }
  (this->super_ShaderAtomicOpCase).m_initialValue = dVar1;
  return;
}

Assistant:

ShaderAtomicMaxCase (Context& context, const char* name, AtomicOperandType operandType, DataType type, Precision precision)
		: ShaderAtomicOpCase(context, name, "atomicMax", operandType, type, precision, UVec3(3,2,1))
	{
		const bool isSigned = m_type == TYPE_INT;
		m_initialValue = isSigned ? (m_precision == PRECISION_LOWP ? -100 : -1000) : 0;
	}